

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_32x32_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  undefined1 (*pauVar1) [32];
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  short sVar13;
  short sVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  int iVar29;
  undefined8 *puVar30;
  long lVar31;
  long in_RDX;
  long lVar32;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int j_5;
  int j_4;
  int j_3;
  int j_2;
  __m256i d [16];
  __m256i dstvec [64];
  int mdif;
  int j;
  __m256i shift;
  int i;
  int base;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int mdif_1;
  int j_1;
  __m256i shift_1;
  int i_1;
  int base_1;
  __m256i res1;
  __m256i res_1 [2];
  __m256i b_1;
  int r_1;
  int x_1;
  __m256i mask256_1;
  __m256i base_inc256_1;
  __m256i max_base_x256_1;
  __m256i diff_1;
  __m256i a_mbase_x_1;
  __m256i c3f_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a1_2;
  __m256i a0_1;
  __m256i a0_2;
  int max_base_x_1;
  int frac_bits_1;
  int local_1bf0;
  int local_1bec;
  int local_1be8;
  int local_1be4;
  undefined8 local_1be0 [77];
  __m256i *in_stack_ffffffffffffe688;
  __m256i *in_stack_ffffffffffffe690;
  undefined8 auStack_15e0 [167];
  int local_10a4;
  int local_1068;
  undefined1 local_1060 [32];
  int local_1008;
  uint local_1004;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  int local_a04;
  int local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_980 [16];
  int local_928;
  uint local_924;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  if (in_R9D < 0xc) {
    auVar3 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar3 = vpinsrw_avx(auVar3,0x10,2);
    auVar3 = vpinsrw_avx(auVar3,0x10,3);
    auVar3 = vpinsrw_avx(auVar3,0x10,4);
    auVar3 = vpinsrw_avx(auVar3,0x10,5);
    auVar3 = vpinsrw_avx(auVar3,0x10,6);
    auVar3 = vpinsrw_avx(auVar3,0x10,7);
    auVar4 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar4 = vpinsrw_avx(auVar4,0x10,2);
    auVar4 = vpinsrw_avx(auVar4,0x10,3);
    auVar4 = vpinsrw_avx(auVar4,0x10,4);
    auVar4 = vpinsrw_avx(auVar4,0x10,5);
    auVar4 = vpinsrw_avx(auVar4,0x10,6);
    auVar4 = vpinsrw_avx(auVar4,0x10,7);
    uStack_dd0 = auVar4._0_8_;
    uStack_dc8 = auVar4._8_8_;
    uVar2 = *(ushort *)(in_RDX + 0x7e);
    auVar4 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,2);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,3);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,4);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,5);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,6);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,7);
    auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,7);
    local_da0 = auVar4._0_8_;
    uStack_d98 = auVar4._8_8_;
    uStack_d90 = auVar5._0_8_;
    uStack_d88 = auVar5._8_8_;
    auVar5 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar5 = vpinsrw_avx(auVar5,0x3f,2);
    auVar5 = vpinsrw_avx(auVar5,0x3f,3);
    auVar5 = vpinsrw_avx(auVar5,0x3f,4);
    auVar5 = vpinsrw_avx(auVar5,0x3f,5);
    auVar5 = vpinsrw_avx(auVar5,0x3f,6);
    auVar5 = vpinsrw_avx(auVar5,0x3f,7);
    auVar6 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar6 = vpinsrw_avx(auVar6,0x3f,2);
    auVar6 = vpinsrw_avx(auVar6,0x3f,3);
    auVar6 = vpinsrw_avx(auVar6,0x3f,4);
    auVar6 = vpinsrw_avx(auVar6,0x3f,5);
    auVar6 = vpinsrw_avx(auVar6,0x3f,6);
    auVar6 = vpinsrw_avx(auVar6,0x3f,7);
    uStack_d50 = auVar6._0_8_;
    uStack_d48 = auVar6._8_8_;
    auVar6 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar6 = vpinsrw_avx(auVar6,0x3f,2);
    auVar6 = vpinsrw_avx(auVar6,0x3f,3);
    auVar6 = vpinsrw_avx(auVar6,0x3f,4);
    auVar6 = vpinsrw_avx(auVar6,0x3f,5);
    auVar6 = vpinsrw_avx(auVar6,0x3f,6);
    auVar6 = vpinsrw_avx(auVar6,0x3f,7);
    auVar7 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar7 = vpinsrw_avx(auVar7,0x3f,2);
    auVar7 = vpinsrw_avx(auVar7,0x3f,3);
    auVar7 = vpinsrw_avx(auVar7,0x3f,4);
    auVar7 = vpinsrw_avx(auVar7,0x3f,5);
    auVar7 = vpinsrw_avx(auVar7,0x3f,6);
    auVar7 = vpinsrw_avx(auVar7,0x3f,7);
    auVar33 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
    uStack_d10 = auVar33._0_8_;
    uStack_d08 = auVar33._8_8_;
    local_1004 = in_R8D;
    for (local_1008 = 0; local_1008 < 0x20; local_1008 = local_1008 + 1) {
      iVar28 = (int)local_1004 >> 6;
      if (0x3e < iVar28) {
        for (local_1068 = local_1008; local_1068 < 0x20; local_1068 = local_1068 + 1) {
          lVar31 = (long)local_1068;
          local_1be0[lVar31 * 4 + 0x40] = local_da0;
          local_1be0[lVar31 * 4 + 0x41] = uStack_d98;
          local_1be0[lVar31 * 4 + 0x42] = uStack_d90;
          local_1be0[lVar31 * 4 + 0x43] = uStack_d88;
          lVar31 = (long)(local_1068 + 0x20);
          local_1be0[lVar31 * 4 + 0x40] = local_da0;
          local_1be0[lVar31 * 4 + 0x41] = uStack_d98;
          local_1be0[lVar31 * 4 + 0x42] = uStack_d90;
          local_1be0[lVar31 * 4 + 0x43] = uStack_d88;
        }
        break;
      }
      auVar33 = vpinsrw_avx(ZEXT216((ushort)local_1004),local_1004 & 0xffff,1);
      auVar33 = vpinsrw_avx(auVar33,local_1004 & 0xffff,2);
      auVar33 = vpinsrw_avx(auVar33,local_1004 & 0xffff,3);
      auVar33 = vpinsrw_avx(auVar33,local_1004 & 0xffff,4);
      auVar33 = vpinsrw_avx(auVar33,local_1004 & 0xffff,5);
      auVar33 = vpinsrw_avx(auVar33,local_1004 & 0xffff,6);
      auVar33 = vpinsrw_avx(auVar33,local_1004 & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216((ushort)local_1004),local_1004 & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,local_1004 & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,local_1004 & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,local_1004 & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,local_1004 & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,local_1004 & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,local_1004 & 0xffff,7);
      auVar34 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar33;
      uStack_cd0 = auVar34._0_8_;
      uStack_cc8 = auVar34._8_8_;
      auVar22._16_8_ = uStack_cd0;
      auVar22._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar8;
      auVar22._24_8_ = uStack_cc8;
      auVar21._16_8_ = uStack_d10;
      auVar21._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
      auVar21._24_8_ = uStack_d08;
      auVar9 = vpand_avx2(auVar22,auVar21);
      auVar9 = vpsrlw_avx2(auVar9,ZEXT416(1));
      for (local_10a4 = 0; local_10a4 < 0x20; local_10a4 = local_10a4 + 0x10) {
        if (0x3f - (iVar28 + local_10a4) < 1) {
          local_1060._16_8_ = uStack_d90;
          local_1060._0_16_ = auVar4;
          local_1060._24_8_ = uStack_d88;
        }
        else {
          pauVar1 = (undefined1 (*) [32])(in_RDX + (long)iVar28 * 2 + (long)local_10a4 * 2);
          auVar12 = vpsubw_avx2(*(undefined1 (*) [32])
                                 (in_RDX + (long)iVar28 * 2 + 2 + (long)local_10a4 * 2),*pauVar1);
          auVar11 = vpsllw_avx2(*pauVar1,ZEXT416(5));
          auVar18._16_8_ = uStack_dd0;
          auVar18._0_16_ = auVar3;
          auVar18._24_8_ = uStack_dc8;
          auVar11 = vpaddw_avx2(auVar11,auVar18);
          auVar12 = vpmullw_avx2(auVar12,auVar9);
          auVar11 = vpaddw_avx2(auVar11,auVar12);
          auVar12 = vpsrlw_avx2(auVar11,ZEXT416(5));
          sVar13 = (short)iVar28;
          sVar14 = (short)local_10a4;
          auVar33 = vpinsrw_avx(ZEXT216((ushort)(sVar13 + sVar14)),
                                (uint)(ushort)(sVar13 + 1 + sVar14),1);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 2 + sVar14),2);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 3 + sVar14),3);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 4 + sVar14),4);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 5 + sVar14),5);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 6 + sVar14),6);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 7 + sVar14),7);
          auVar8 = vpinsrw_avx(ZEXT216((ushort)(sVar13 + 8 + sVar14)),
                               (uint)(ushort)(sVar13 + 9 + sVar14),1);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 10 + sVar14),2);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xb + sVar14),3);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xc + sVar14),4);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xd + sVar14),5);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xe + sVar14),6);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xf + sVar14),7);
          uStack_ab0 = auVar8._0_8_;
          uStack_aa8 = auVar8._8_8_;
          auVar20._16_8_ = uStack_d50;
          auVar20._0_16_ = auVar5;
          auVar20._24_8_ = uStack_d48;
          auVar19._16_8_ = uStack_ab0;
          auVar19._0_16_ = auVar33;
          auVar19._24_8_ = uStack_aa8;
          auVar11 = vpcmpgtw_avx2(auVar20,auVar19);
          auVar23._16_8_ = uStack_d90;
          auVar23._0_16_ = auVar4;
          auVar23._24_8_ = uStack_d88;
          local_1060 = vpblendvb_avx2(auVar23,auVar12,auVar11);
        }
        if (local_10a4 == 0) {
          lVar31 = (long)local_1008;
          local_1be0[lVar31 * 4 + 0x40] = local_1060._0_8_;
          local_1be0[lVar31 * 4 + 0x41] = local_1060._8_8_;
          local_1be0[lVar31 * 4 + 0x42] = local_1060._16_8_;
          local_1be0[lVar31 * 4 + 0x43] = local_1060._24_8_;
        }
        else {
          lVar31 = (long)(local_1008 + 0x20);
          local_1be0[lVar31 * 4 + 0x40] = local_1060._0_8_;
          local_1be0[lVar31 * 4 + 0x41] = local_1060._8_8_;
          local_1be0[lVar31 * 4 + 0x42] = local_1060._16_8_;
          local_1be0[lVar31 * 4 + 0x43] = local_1060._24_8_;
        }
      }
      local_1004 = in_R8D + local_1004;
    }
  }
  else {
    auVar3 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar3 = vpinsrd_avx(auVar3,0x10,2);
    auVar3 = vpinsrd_avx(auVar3,0x10,3);
    auVar4 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar4 = vpinsrd_avx(auVar4,0x10,2);
    auVar4 = vpinsrd_avx(auVar4,0x10,3);
    uStack_550 = auVar4._0_8_;
    uStack_548 = auVar4._8_8_;
    uVar2 = *(ushort *)(in_RDX + 0x7e);
    auVar4 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,2);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,3);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,4);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,5);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,6);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,7);
    auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,7);
    local_720 = auVar4._0_8_;
    uStack_718 = auVar4._8_8_;
    uStack_710 = auVar5._0_8_;
    uStack_708 = auVar5._8_8_;
    auVar5 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar5 = vpinsrw_avx(auVar5,0x3f,2);
    auVar5 = vpinsrw_avx(auVar5,0x3f,3);
    auVar5 = vpinsrw_avx(auVar5,0x3f,4);
    auVar5 = vpinsrw_avx(auVar5,0x3f,5);
    auVar5 = vpinsrw_avx(auVar5,0x3f,6);
    auVar5 = vpinsrw_avx(auVar5,0x3f,7);
    auVar6 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar6 = vpinsrw_avx(auVar6,0x3f,2);
    auVar6 = vpinsrw_avx(auVar6,0x3f,3);
    auVar6 = vpinsrw_avx(auVar6,0x3f,4);
    auVar6 = vpinsrw_avx(auVar6,0x3f,5);
    auVar6 = vpinsrw_avx(auVar6,0x3f,6);
    auVar6 = vpinsrw_avx(auVar6,0x3f,7);
    uStack_6d0 = auVar6._0_8_;
    uStack_6c8 = auVar6._8_8_;
    auVar6 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar6 = vpinsrw_avx(auVar6,0x3f,2);
    auVar6 = vpinsrw_avx(auVar6,0x3f,3);
    auVar6 = vpinsrw_avx(auVar6,0x3f,4);
    auVar6 = vpinsrw_avx(auVar6,0x3f,5);
    auVar6 = vpinsrw_avx(auVar6,0x3f,6);
    auVar6 = vpinsrw_avx(auVar6,0x3f,7);
    auVar7 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar7 = vpinsrw_avx(auVar7,0x3f,2);
    auVar7 = vpinsrw_avx(auVar7,0x3f,3);
    auVar7 = vpinsrw_avx(auVar7,0x3f,4);
    auVar7 = vpinsrw_avx(auVar7,0x3f,5);
    auVar7 = vpinsrw_avx(auVar7,0x3f,6);
    auVar7 = vpinsrw_avx(auVar7,0x3f,7);
    auVar33 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
    uStack_690 = auVar33._0_8_;
    uStack_688 = auVar33._8_8_;
    local_924 = in_R8D;
    for (local_928 = 0; local_928 < 0x20; local_928 = local_928 + 1) {
      iVar28 = (int)local_924 >> 6;
      if (0x3e < iVar28) {
        for (local_9c8 = local_928; local_9c8 < 0x20; local_9c8 = local_9c8 + 1) {
          lVar31 = (long)local_9c8;
          local_1be0[lVar31 * 4 + 0x40] = local_720;
          local_1be0[lVar31 * 4 + 0x41] = uStack_718;
          local_1be0[lVar31 * 4 + 0x42] = uStack_710;
          local_1be0[lVar31 * 4 + 0x43] = uStack_708;
          lVar31 = (long)(local_9c8 + 0x20);
          local_1be0[lVar31 * 4 + 0x40] = local_720;
          local_1be0[lVar31 * 4 + 0x41] = uStack_718;
          local_1be0[lVar31 * 4 + 0x42] = uStack_710;
          local_1be0[lVar31 * 4 + 0x43] = uStack_708;
        }
        break;
      }
      auVar33 = vpinsrd_avx(ZEXT416(local_924),local_924,1);
      auVar33 = vpinsrd_avx(auVar33,local_924,2);
      auVar33 = vpinsrd_avx(auVar33,local_924,3);
      auVar8 = vpinsrd_avx(ZEXT416(local_924),local_924,1);
      auVar8 = vpinsrd_avx(auVar8,local_924,2);
      auVar8 = vpinsrd_avx(auVar8,local_924,3);
      auVar34 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar33;
      uStack_510 = auVar34._0_8_;
      uStack_508 = auVar34._8_8_;
      auVar11._16_8_ = uStack_510;
      auVar11._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar8;
      auVar11._24_8_ = uStack_508;
      auVar9._16_8_ = uStack_690;
      auVar9._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
      auVar9._24_8_ = uStack_688;
      auVar9 = vpand_avx2(auVar11,auVar9);
      auVar9 = vpsrld_avx2(auVar9,ZEXT416(1));
      for (local_a04 = 0; local_a04 < 0x20; local_a04 = local_a04 + 0x10) {
        iVar29 = 0x3f - (iVar28 + local_a04);
        if (iVar29 < 1) {
          local_9c0._16_8_ = uStack_710;
          local_9c0._0_16_ = auVar4;
          local_9c0._24_8_ = uStack_708;
        }
        else {
          auVar11 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                    (in_RDX + (long)iVar28 * 2 + (long)local_a04 * 2));
          auVar12 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                    (in_RDX + (long)iVar28 * 2 + 2 + (long)local_a04 * 2));
          auVar12 = vpsubd_avx2(auVar12,auVar11);
          auVar11 = vpslld_avx2(auVar11,ZEXT416(5));
          auVar10._16_8_ = uStack_550;
          auVar10._0_16_ = auVar3;
          auVar10._24_8_ = uStack_548;
          auVar11 = vpaddd_avx2(auVar11,auVar10);
          auVar12 = vpmulld_avx2(auVar12,auVar9);
          auVar11 = vpaddd_avx2(auVar11,auVar12);
          auVar11 = vpsrld_avx2(auVar11,ZEXT416(5));
          auVar11 = vpackusdw_avx2(auVar11,ZEXT1632(auVar11._16_16_));
          local_980 = auVar4;
          if (8 < iVar29) {
            auVar12 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                      (in_RDX + (long)iVar28 * 2 + 0x10 + (long)local_a04 * 2));
            auVar10 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                      (in_RDX + (long)iVar28 * 2 + 0x12 + (long)local_a04 * 2));
            auVar10 = vpsubd_avx2(auVar10,auVar12);
            auVar12 = vpslld_avx2(auVar12,ZEXT416(5));
            auVar25._16_8_ = uStack_550;
            auVar25._0_16_ = auVar3;
            auVar25._24_8_ = uStack_548;
            auVar12 = vpaddd_avx2(auVar12,auVar25);
            auVar10 = vpmulld_avx2(auVar10,auVar9);
            auVar12 = vpaddd_avx2(auVar12,auVar10);
            auVar12 = vpsrld_avx2(auVar12,ZEXT416(5));
            auVar12 = vpackusdw_avx2(auVar12,ZEXT1632(auVar12._16_16_));
            local_980 = auVar12._0_16_;
          }
          auVar34 = ZEXT116(0) * auVar11._16_16_ + ZEXT116(1) * local_980;
          sVar13 = (short)iVar28;
          sVar14 = (short)local_a04;
          auVar33 = vpinsrw_avx(ZEXT216((ushort)(sVar13 + sVar14)),
                                (uint)(ushort)(sVar13 + 1 + sVar14),1);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 2 + sVar14),2);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 3 + sVar14),3);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 4 + sVar14),4);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 5 + sVar14),5);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 6 + sVar14),6);
          auVar33 = vpinsrw_avx(auVar33,(uint)(ushort)(sVar13 + 7 + sVar14),7);
          auVar8 = vpinsrw_avx(ZEXT216((ushort)(sVar13 + 8 + sVar14)),
                               (uint)(ushort)(sVar13 + 9 + sVar14),1);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 10 + sVar14),2);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xb + sVar14),3);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xc + sVar14),4);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xd + sVar14),5);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xe + sVar14),6);
          auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar13 + 0xf + sVar14),7);
          uStack_170 = auVar8._0_8_;
          uStack_168 = auVar8._8_8_;
          auVar24._16_8_ = uStack_6d0;
          auVar24._0_16_ = auVar5;
          auVar24._24_8_ = uStack_6c8;
          auVar12._16_8_ = uStack_170;
          auVar12._0_16_ = auVar33;
          auVar12._24_8_ = uStack_168;
          auVar12 = vpcmpgtw_avx2(auVar24,auVar12);
          local_9c0._16_8_ = auVar34._0_8_;
          local_9c0._24_8_ = auVar34._8_8_;
          auVar27._16_8_ = uStack_710;
          auVar27._0_16_ = auVar4;
          auVar27._24_8_ = uStack_708;
          auVar26._16_8_ = local_9c0._16_8_;
          auVar26._0_16_ = ZEXT116(0) * local_980 + ZEXT116(1) * auVar11._0_16_;
          auVar26._24_8_ = local_9c0._24_8_;
          local_9c0 = vpblendvb_avx2(auVar27,auVar26,auVar12);
        }
        if (local_a04 == 0) {
          lVar31 = (long)local_928;
          local_1be0[lVar31 * 4 + 0x40] = local_9c0._0_8_;
          local_1be0[lVar31 * 4 + 0x41] = local_9c0._8_8_;
          local_1be0[lVar31 * 4 + 0x42] = local_9c0._16_8_;
          local_1be0[lVar31 * 4 + 0x43] = local_9c0._24_8_;
        }
        else {
          lVar31 = (long)(local_928 + 0x20);
          local_1be0[lVar31 * 4 + 0x40] = local_9c0._0_8_;
          local_1be0[lVar31 * 4 + 0x41] = local_9c0._8_8_;
          local_1be0[lVar31 * 4 + 0x42] = local_9c0._16_8_;
          local_1be0[lVar31 * 4 + 0x43] = local_9c0._24_8_;
        }
      }
      local_924 = in_R8D + local_924;
    }
  }
  highbd_transpose16x16_avx2(in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  for (local_1be4 = 0; local_1be4 < 0x10; local_1be4 = local_1be4 + 1) {
    puVar30 = (undefined8 *)(in_RDI + local_1be4 * in_RSI * 2);
    lVar31 = (long)local_1be4;
    uVar15 = local_1be0[lVar31 * 4 + 1];
    uVar16 = local_1be0[lVar31 * 4 + 2];
    uVar17 = local_1be0[lVar31 * 4 + 3];
    *puVar30 = local_1be0[lVar31 * 4];
    puVar30[1] = uVar15;
    puVar30[2] = uVar16;
    puVar30[3] = uVar17;
  }
  highbd_transpose16x16_avx2(in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  for (local_1be8 = 0; local_1be8 < 0x10; local_1be8 = local_1be8 + 1) {
    lVar31 = in_RDI + local_1be8 * in_RSI * 2;
    lVar32 = (long)local_1be8;
    uVar15 = local_1be0[lVar32 * 4 + 1];
    uVar16 = local_1be0[lVar32 * 4 + 2];
    uVar17 = local_1be0[lVar32 * 4 + 3];
    *(undefined8 *)(lVar31 + 0x20) = local_1be0[lVar32 * 4];
    *(undefined8 *)(lVar31 + 0x28) = uVar15;
    *(undefined8 *)(lVar31 + 0x30) = uVar16;
    *(undefined8 *)(lVar31 + 0x38) = uVar17;
  }
  highbd_transpose16x16_avx2(in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  for (local_1bec = 0; local_1bec < 0x10; local_1bec = local_1bec + 1) {
    puVar30 = (undefined8 *)(in_RDI + (local_1bec + 0x10) * in_RSI * 2);
    lVar31 = (long)local_1bec;
    uVar15 = local_1be0[lVar31 * 4 + 1];
    uVar16 = local_1be0[lVar31 * 4 + 2];
    uVar17 = local_1be0[lVar31 * 4 + 3];
    *puVar30 = local_1be0[lVar31 * 4];
    puVar30[1] = uVar15;
    puVar30[2] = uVar16;
    puVar30[3] = uVar17;
  }
  highbd_transpose16x16_avx2(in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  for (local_1bf0 = 0; local_1bf0 < 0x10; local_1bf0 = local_1bf0 + 1) {
    lVar31 = in_RDI + (local_1bf0 + 0x10) * in_RSI * 2;
    lVar32 = (long)local_1bf0;
    uVar15 = local_1be0[lVar32 * 4 + 1];
    uVar16 = local_1be0[lVar32 * 4 + 2];
    uVar17 = local_1be0[lVar32 * 4 + 3];
    *(undefined8 *)(lVar31 + 0x20) = local_1be0[lVar32 * 4];
    *(undefined8 *)(lVar31 + 0x28) = uVar15;
    *(undefined8 *)(lVar31 + 0x30) = uVar16;
    *(undefined8 *)(lVar31 + 0x38) = uVar17;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z3_32x32_avx2(uint16_t *dst, ptrdiff_t stride,
                                               const uint16_t *left,
                                               int upsample_left, int dy,
                                               int bd) {
  __m256i dstvec[64], d[16];
  if (bd < 12) {
    highbd_dr_prediction_z1_32xN_internal_avx2(32, dstvec, left, upsample_left,
                                               dy);
  } else {
    highbd_dr_prediction_32bit_z1_32xN_internal_avx2(32, dstvec, left,
                                                     upsample_left, dy);
  }
  highbd_transpose16x16_avx2(dstvec, d);
  for (int j = 0; j < 16; j++) {
    _mm256_storeu_si256((__m256i *)(dst + j * stride), d[j]);
  }
  highbd_transpose16x16_avx2(dstvec + 16, d);
  for (int j = 0; j < 16; j++) {
    _mm256_storeu_si256((__m256i *)(dst + j * stride + 16), d[j]);
  }
  highbd_transpose16x16_avx2(dstvec + 32, d);
  for (int j = 0; j < 16; j++) {
    _mm256_storeu_si256((__m256i *)(dst + (j + 16) * stride), d[j]);
  }
  highbd_transpose16x16_avx2(dstvec + 48, d);
  for (int j = 0; j < 16; j++) {
    _mm256_storeu_si256((__m256i *)(dst + (j + 16) * stride + 16), d[j]);
  }
}